

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O0

void * mpp_osal_malloc(char *caller,size_t size)

{
  uint uVar1;
  MppMemService *this;
  size_t local_58;
  undefined1 local_50 [8];
  AutoMutex auto_lock;
  void *ptr;
  size_t size_real;
  size_t size_align;
  RK_U32 debug;
  MppMemService *srv;
  size_t size_local;
  char *caller_local;
  
  this = MppMemService::get_inst();
  uVar1 = this->debug;
  local_58 = size + 0x1f & 0xffffffffffffffe0;
  if ((uVar1 & 0x10) != 0) {
    local_58 = local_58 + 0x40;
  }
  os_malloc(&auto_lock.mLock,0x20,local_58);
  if (uVar1 != 0) {
    Mutex::Autolock::Autolock((Autolock *)local_50,this->m_lock,1);
    MppMemService::add_log(this,MEM_MALLOC,caller,(void *)0x0,auto_lock.mLock,size,local_58);
    if (auto_lock.mLock != (Mutex *)0x0) {
      if ((uVar1 & 0x10) != 0) {
        auto_lock.mLock = (Mutex *)&((auto_lock.mLock)->mMutex).__data.__list.__next;
        set_mem_ext_room(auto_lock.mLock,size);
      }
      MppMemService::add_node(this,caller,auto_lock.mLock,size);
    }
    Mutex::Autolock::~Autolock((Autolock *)local_50);
  }
  return auto_lock.mLock;
}

Assistant:

void *mpp_osal_malloc(const char *caller, size_t size)
{
    MppMemService *srv = MppMemService::get_inst();
    RK_U32 debug = srv->debug;
    size_t size_align = MEM_ALIGNED(size);
    size_t size_real = (debug & MEM_EXT_ROOM) ? (size_align + 2 * MEM_ALIGN) :
                       (size_align);
    void *ptr;

    os_malloc(&ptr, MEM_ALIGN, size_real);

    if (debug) {
        AutoMutex auto_lock(srv->m_lock);
        srv->add_log(MEM_MALLOC, caller, NULL, ptr, size, size_real);

        if (ptr) {
            if (debug & MEM_EXT_ROOM) {
                ptr = (RK_U8 *)ptr + MEM_ALIGN;
                set_mem_ext_room(ptr, size);
            }

            srv->add_node(caller, ptr, size);
        }
    }

    return ptr;
}